

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_statistics.cpp
# Opt level: O2

shared_ptr<duckdb::ColumnStatistics,_true> __thiscall
duckdb::ColumnStatistics::Copy(ColumnStatistics *this)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  BaseStatistics *in_RSI;
  shared_ptr<duckdb::ColumnStatistics,_true> sVar2;
  undefined1 local_70 [96];
  
  BaseStatistics::Copy((BaseStatistics *)(local_70 + 8),in_RSI);
  lVar1._0_1_ = in_RSI[1].type.id_;
  lVar1._1_1_ = in_RSI[1].type.physical_type_;
  lVar1._2_6_ = *(undefined6 *)&in_RSI[1].type.field_0x2;
  if (lVar1 == 0) {
    local_70._0_8_ =
         (__uniq_ptr_data<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true,_true>
         )0x0;
  }
  else {
    unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>::
    operator->((unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
                *)(in_RSI + 1));
    DistinctStatistics::Copy((DistinctStatistics *)local_70);
  }
  make_shared_ptr<duckdb::ColumnStatistics,duckdb::BaseStatistics,duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>>
            (&this->stats,
             (unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
              *)(local_70 + 8));
  ::std::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>::
  ~unique_ptr((unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
               *)local_70);
  BaseStatistics::~BaseStatistics((BaseStatistics *)(local_70 + 8));
  sVar2.internal.super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (shared_ptr<duckdb::ColumnStatistics,_true>)
         sVar2.internal.super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ColumnStatistics> ColumnStatistics::Copy() const {
	return make_shared_ptr<ColumnStatistics>(stats.Copy(), distinct_stats ? distinct_stats->Copy() : nullptr);
}